

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * google::protobuf::anon_unknown_1::ToJsonName(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar2 = 0;
    bVar3 = false;
    do {
      bVar1 = true;
      if ((input->_M_dataplus)._M_p[uVar2] != '_') {
        if (bVar3) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar1 = false;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar1 = bVar3;
        }
      }
      bVar3 = bVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}